

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.cpp
# Opt level: O3

string * __thiscall
pbrt::ToString_abi_cxx11_(string *__return_storage_ptr__,pbrt *this,RandomizeStrategy r)

{
  char *pcVar1;
  char *pcVar2;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "None";
    pcVar1 = "";
    break;
  case 1:
    pcVar2 = "CranleyPatterson";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "Xor";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "Owen";
    pcVar1 = "";
    break;
  default:
    LogFatal(Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/lowdiscrepancy.cpp"
             ,0x53,"Unhandled RandomizeStrategy");
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString(RandomizeStrategy r) {
    switch (r) {
    case RandomizeStrategy::None:
        return "None";
    case RandomizeStrategy::CranleyPatterson:
        return "CranleyPatterson";
    case RandomizeStrategy::Xor:
        return "Xor";
    case RandomizeStrategy::Owen:
        return "Owen";
    default:
        LOG_FATAL("Unhandled RandomizeStrategy");
        return "";
    }
}